

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

void __thiscall
imrt::EvaluationFunction::get_vc_sorted_beamlets
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
          *sorted_set)

{
  _List_node_base *p_Var1;
  Station *pSVar2;
  int iVar3;
  int iVar4;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *plVar5;
  double dVar6;
  pair<double,_double> pVar7;
  pair<double,_std::pair<imrt::Station_*,_int>_> local_48;
  
  plVar5 = Plan::get_stations_abi_cxx11_(p);
  for (p_Var1 = (plVar5->super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>).
                _M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)plVar5;
      p_Var1 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&p_Var1->_M_next)
               ->_M_impl)._M_node.super__List_node_base._M_next) {
    pSVar2 = (Station *)p_Var1[1]._M_next;
    iVar3 = Collimator::getNangleBeamlets(pSVar2->collimator,pSVar2->angle);
    if (0 < iVar3) {
      iVar3 = 0;
      do {
        pVar7 = get_value_cost(this,pSVar2->angle,iVar3,Zmin,Zmax);
        dVar6 = pVar7.first / pVar7.second;
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          local_48.first = dVar6;
          local_48.second.first = pSVar2;
          local_48.second.second = iVar3;
          std::
          _Rb_tree<double,std::pair<double_const,std::pair<imrt::Station*,int>>,std::_Select1st<std::pair<double_const,std::pair<imrt::Station*,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double_const,std::pair<imrt::Station*,int>>>>
          ::_M_emplace_equal<std::pair<double,std::pair<imrt::Station*,int>>>
                    ((_Rb_tree<double,std::pair<double_const,std::pair<imrt::Station*,int>>,std::_Select1st<std::pair<double_const,std::pair<imrt::Station*,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double_const,std::pair<imrt::Station*,int>>>>
                      *)sorted_set,&local_48);
        }
        iVar3 = iVar3 + 1;
        iVar4 = Collimator::getNangleBeamlets(pSVar2->collimator,pSVar2->angle);
      } while (iVar3 < iVar4);
    }
  }
  return;
}

Assistant:

void EvaluationFunction::get_vc_sorted_beamlets(Plan& p, vector<double>& Zmin, vector<double>& Zmax,
		multimap < double, pair<Station*, int>, MagnitudeCompare >& sorted_set){
	//the sorted set of beamlets

	double max_ev=0.0;
	for(auto s:p.get_stations()){
		for(int b=0; b<s->getNbBeamlets(); b++){
			pair<double,double> value_cost=get_value_cost(s->getAngle(), b, Zmin, Zmax);
            double ev=value_cost.first/value_cost.second;
			if(ev==0) continue;
			sorted_set.insert(make_pair (ev,  make_pair(s,b)));
		}
	}

}